

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_stream.cpp
# Opt level: O2

void __thiscall StreamSong::Play(StreamSong *this,bool looping,int subsong)

{
  int iVar1;
  
  (this->super_MusInfo).m_Status = STATE_Stopped;
  (this->super_MusInfo).m_Looping = looping;
  iVar1 = (*this->m_Stream->_vptr_SoundStream[2])(0x3f800000);
  if ((char)iVar1 != '\0') {
    if (subsong != 0) {
      (*this->m_Stream->_vptr_SoundStream[9])(this->m_Stream,(ulong)(uint)subsong);
    }
    (this->super_MusInfo).m_Status = STATE_Playing;
  }
  return;
}

Assistant:

void StreamSong::Play (bool looping, int subsong)
{
	m_Status = STATE_Stopped;
	m_Looping = looping;

	if (m_Stream->Play (m_Looping, 1))
	{
		if (subsong != 0)
		{
			m_Stream->SetOrder (subsong);
		}
		m_Status = STATE_Playing;
	}
}